

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artest2.c
# Opt level: O2

double ar_mean(double *x,int N)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + x[uVar1];
  }
  return dVar3 / (double)N;
}

Assistant:

double ar_mean(double *x, int N) {
	double mn;
	int i;

	mn = 0.0;

	for(i = 0; i < N;++i) {
		mn += x[i];
	}

	mn /= (double) N;

	return mn;
}